

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

size_t __thiscall cmCTestMultiProcessHandler::GetParallelLevel(cmCTestMultiProcessHandler *this)

{
  bool bVar1;
  unsigned_long *puVar2;
  cmCTestMultiProcessHandler *this_local;
  
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->ParallelLevel);
  if (((bVar1) &&
      (puVar2 = std::optional<unsigned_long>::operator*(&this->ParallelLevel), *puVar2 == 0)) ||
     ((bVar1 = std::optional::operator_cast_to_bool((optional *)&this->ParallelLevel), !bVar1 &&
      (bVar1 = std::optional::operator_cast_to_bool((optional *)&this->JobServerClient), bVar1)))) {
    this_local = (cmCTestMultiProcessHandler *)0x10000;
  }
  else {
    bVar1 = std::optional::operator_cast_to_bool((optional *)&this->ParallelLevel);
    if (bVar1) {
      puVar2 = std::optional<unsigned_long>::operator*(&this->ParallelLevel);
      this_local = (cmCTestMultiProcessHandler *)*puVar2;
    }
    else {
      this_local = (cmCTestMultiProcessHandler *)this->ParallelLevelDefault;
    }
  }
  return (size_t)this_local;
}

Assistant:

size_t cmCTestMultiProcessHandler::GetParallelLevel() const
{
  if ((this->ParallelLevel && *this->ParallelLevel == 0) ||
      (!this->ParallelLevel && this->JobServerClient)) {
    return kParallelLevelUnbounded;
  }
  if (this->ParallelLevel) {
    return *this->ParallelLevel;
  }
  return this->ParallelLevelDefault;
}